

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<int>::resize(QList<int> *this,qsizetype size)

{
  qsizetype qVar1;
  QArrayDataPointer<int> *in_RSI;
  QArrayDataPointer<int> *in_RDI;
  QList<int> *unaff_retaddr;
  QArrayDataPointer<int> *this_00;
  
  resize_internal(unaff_retaddr,(qsizetype)in_RDI);
  this_00 = in_RSI;
  qVar1 = QList<int>::size((QList<int> *)in_RDI);
  if (qVar1 < (long)in_RSI) {
    QArrayDataPointer<int>::operator->(in_RDI);
    QArrayDataPointer<int>::appendInitialize(this_00,(qsizetype)in_RSI);
  }
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }